

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RowSetClear(RowSet *p)

{
  undefined8 *in_RDI;
  RowSetChunk *pNextChunk;
  RowSetChunk *pChunk;
  sqlite3 *p_00;
  sqlite3 *db;
  
  db = (sqlite3 *)*in_RDI;
  while (db != (sqlite3 *)0x0) {
    p_00 = (sqlite3 *)db->pVfs;
    sqlite3DbFree(db,p_00);
    db = p_00;
  }
  *in_RDI = 0;
  *(undefined2 *)(in_RDI + 6) = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[5] = 0;
  *(undefined2 *)((long)in_RDI + 0x32) = 1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RowSetClear(RowSet *p){
  struct RowSetChunk *pChunk, *pNextChunk;
  for(pChunk=p->pChunk; pChunk; pChunk = pNextChunk){
    pNextChunk = pChunk->pNextChunk;
    sqlite3DbFree(p->db, pChunk);
  }
  p->pChunk = 0;
  p->nFresh = 0;
  p->pEntry = 0;
  p->pLast = 0;
  p->pForest = 0;
  p->rsFlags = ROWSET_SORTED;
}